

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O2

int __thiscall tetgenmesh::getedge(tetgenmesh *this,point e1,point e2,triface *tedge)

{
  uint *puVar1;
  uint uVar2;
  arraypool *this_00;
  char *pcVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  int iVar7;
  uint uVar8;
  tetrahedron *pppdVar9;
  bool bVar10;
  triface searchtet;
  ulong *local_48;
  triface *local_40;
  long local_38;
  
  searchtet.tet = (tetrahedron *)0x0;
  searchtet.ver = 0;
  if (2 < this->b->verbose) {
    printf("      Get edge from %d to %d.\n",
           (ulong)*(uint *)((long)e1 + (long)this->pointmarkindex * 4),
           (ulong)*(uint *)((long)e2 + (long)this->pointmarkindex * 4));
  }
  pppdVar9 = tedge->tet;
  if ((pppdVar9 == (tetrahedron *)0x0) || (pppdVar9[4] == (tetrahedron)0x0)) {
LAB_0011e6b4:
    point2tetorg(this,e1,tedge);
    finddirection(this,tedge,e2);
    iVar7 = 1;
    if (tedge->tet[destpivot[tedge->ver]] != (tetrahedron)e2) {
      point2tetorg(this,e2,tedge);
      finddirection(this,tedge,e1);
      if (tedge->tet[destpivot[tedge->ver]] == (tetrahedron)e1) {
        iVar4 = esymtbl[tedge->ver];
LAB_0011e991:
        tedge->ver = iVar4;
      }
      else {
        point2tetorg(this,e1,&searchtet);
        searchtet.ver = enextesymtbl[searchtet.ver];
        this_00 = this->cavebdrylist;
        iVar4 = 3;
        while( true ) {
          bVar10 = iVar4 == 0;
          iVar4 = iVar4 + -1;
          if (bVar10) break;
          if (searchtet.tet[apexpivot[searchtet.ver]] == (tetrahedron)e2) {
            tedge->tet = searchtet.tet;
            iVar4 = eorgoppotbl[searchtet.ver];
            goto LAB_0011e991;
          }
          searchtet.ver = enexttbl[searchtet.ver];
        }
        pppdVar9 = (tetrahedron *)
                   ((ulong)searchtet.tet[facepivot1[searchtet.ver]] & 0xfffffffffffffff0);
        iVar4 = esymtbl[facepivot2[searchtet.ver]
                        [(uint)searchtet.tet[facepivot1[searchtet.ver]] & 0xf]];
        if (pppdVar9[apexpivot[iVar4]] == (tetrahedron)e2) {
          tedge->tet = pppdVar9;
          tedge->ver = eorgoppotbl[iVar4];
        }
        else {
          puVar1 = (uint *)((long)searchtet.tet + (long)this->elemmarkerindex * 4);
          *puVar1 = *puVar1 | 1;
          local_40 = tedge;
          arraypool::newindex(this_00,&local_48);
          *local_48 = (ulong)searchtet.tet;
          *(int *)(local_48 + 1) = searchtet.ver;
          puVar1 = (uint *)((long)pppdVar9 + (long)this->elemmarkerindex * 4);
          *puVar1 = *puVar1 | 1;
          arraypool::newindex(this_00,&local_48);
          *local_48 = (ulong)pppdVar9;
          *(int *)(local_48 + 1) = iVar4;
          iVar7 = 0;
          for (local_38 = 0; (lVar5 = this_00->objects, iVar7 == 0 && (local_38 < lVar5));
              local_38 = local_38 + 1) {
            pcVar3 = this_00->toparray
                     [(uint)local_38 >> ((byte)this_00->log2objectsperblock & 0x1f)];
            lVar5 = (long)this_00->objectbytes *
                    (long)(int)(this_00->objectsperblockmark & (uint)local_38);
            local_48 = (ulong *)(pcVar3 + lVar5);
            searchtet.tet = *(tetrahedron **)(pcVar3 + lVar5);
            searchtet.ver = *(int *)(pcVar3 + lVar5 + 8);
            iVar7 = 0;
            for (uVar8 = 0; (iVar7 == 0 && (uVar8 < 2)); uVar8 = uVar8 + 1) {
              searchtet.ver = enexttbl[searchtet.ver];
              pppdVar9 = (tetrahedron *)
                         ((ulong)searchtet.tet[facepivot1[searchtet.ver]] & 0xfffffffffffffff0);
              uVar2 = *(uint *)((long)pppdVar9 + (long)this->elemmarkerindex * 4);
              iVar7 = 0;
              if ((uVar2 & 1) == 0) {
                iVar4 = esymtbl[facepivot2[searchtet.ver]
                                [(uint)searchtet.tet[facepivot1[searchtet.ver]] & 0xf]];
                if (pppdVar9[apexpivot[iVar4]] == (tetrahedron)e2) {
                  local_40->tet = pppdVar9;
                  local_40->ver = eorgoppotbl[iVar4];
                  iVar7 = 1;
                }
                else {
                  *(uint *)((long)pppdVar9 + (long)this->elemmarkerindex * 4) = uVar2 | 1;
                  arraypool::newindex(this_00,&local_48);
                  *local_48 = (ulong)pppdVar9;
                  *(int *)(local_48 + 1) = iVar4;
                }
              }
            }
          }
          lVar6 = 0;
          if (lVar5 < 1) {
            lVar5 = lVar6;
          }
          for (; lVar5 != lVar6; lVar6 = lVar6 + 1) {
            puVar1 = (uint *)(*(long *)(this_00->toparray
                                        [(uint)lVar6 >> ((byte)this_00->log2objectsperblock & 0x1f)]
                                       + (long)this_00->objectbytes *
                                         (long)(int)(this_00->objectsperblockmark & (uint)lVar6)) +
                             (long)this->elemmarkerindex * 4);
            *puVar1 = *puVar1 & 0xfffffffe;
          }
          this_00->objects = 0;
        }
      }
    }
  }
  else {
    iVar7 = tedge->ver;
    if (pppdVar9[orgpivot[iVar7]] == (tetrahedron)e1) {
      if (pppdVar9[destpivot[iVar7]] != (tetrahedron)e2) goto LAB_0011e6b4;
    }
    else {
      if ((pppdVar9[orgpivot[iVar7]] != (tetrahedron)e2) ||
         (pppdVar9[destpivot[iVar7]] != (tetrahedron)e1)) goto LAB_0011e6b4;
      tedge->ver = esymtbl[iVar7];
    }
    iVar7 = 1;
  }
  return iVar7;
}

Assistant:

int tetgenmesh::getedge(point e1, point e2, triface *tedge)
{
  triface searchtet, neightet, *parytet;
  point pt;
  int done;
  int i, j;

  if (b->verbose > 2) {
    printf("      Get edge from %d to %d.\n", pointmark(e1), pointmark(e2));
  }

  // Quickly check if 'tedge' is just this edge.
  if (!isdeadtet(*tedge)) {
    if (org(*tedge) == e1) {
      if (dest(*tedge) == e2) {
        return 1;
      }
    } else if (org(*tedge) == e2) {
      if (dest(*tedge) == e1) {
        esymself(*tedge);
        return 1;
      }
    }
  }

  // Search for the edge [e1, e2].
  point2tetorg(e1, *tedge);
  finddirection(tedge, e2);
  if (dest(*tedge) == e2) {
    return 1;
  } else {
    // Search for the edge [e2, e1].
    point2tetorg(e2, *tedge);
    finddirection(tedge, e1);
    if (dest(*tedge) == e1) {
      esymself(*tedge);
      return 1;
    }
  }


  // Go to the link face of e1.
  point2tetorg(e1, searchtet);
  enextesymself(searchtet);
  arraypool *tetlist = cavebdrylist;

  // Search e2.
  for (i = 0; i < 3; i++) {
    pt = apex(searchtet);
    if (pt == e2) {
      // Found. 'searchtet' is [#,#,e2,e1].
      eorgoppo(searchtet, *tedge); // [e1,e2,#,#].
      return 1;
    }
    enextself(searchtet);
  }

  // Get the adjacent link face at 'searchtet'.
  fnext(searchtet, neightet);
  esymself(neightet);
  // assert(oppo(neightet) == e1);
  pt = apex(neightet);
  if (pt == e2) {
    // Found. 'neightet' is [#,#,e2,e1].
    eorgoppo(neightet, *tedge); // [e1,e2,#,#].
    return 1;
  }

  // Continue searching in the link face of e1.
  infect(searchtet);
  tetlist->newindex((void **) &parytet);
  *parytet = searchtet;
  infect(neightet);
  tetlist->newindex((void **) &parytet);
  *parytet = neightet;

  done = 0;

  for (i = 0; (i < tetlist->objects) && !done; i++) {
    parytet = (triface *) fastlookup(tetlist, i);
    searchtet = *parytet;
    for (j = 0; (j < 2) && !done; j++) {
      enextself(searchtet);
      fnext(searchtet, neightet);
      if (!infected(neightet)) {        
        esymself(neightet);
        pt = apex(neightet);
        if (pt == e2) {
          // Found. 'neightet' is [#,#,e2,e1].
          eorgoppo(neightet, *tedge);
          done = 1;
        } else {
          infect(neightet);
          tetlist->newindex((void **) &parytet);
          *parytet = neightet;
        }
      }
    } // j
  } // i 

  // Uninfect the list of visited tets.
  for (i = 0; i < tetlist->objects; i++) {
    parytet = (triface *) fastlookup(tetlist, i);
    uninfect(*parytet);
  }
  tetlist->restart();

  return done;
}